

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O3

string * __thiscall Klex::parseOutWord_abi_cxx11_(string *__return_storage_ptr__,Klex *this)

{
  CharClass CVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  CVar1 = this->charClass;
  while (CVar1 < SINGLE_QUOTE) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    nextChar(this);
    CVar1 = this->charClass;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Klex::parseOutWord() {
    std::string lexeme;

    while(getCharClass() == CharClass::LETTER || getCharClass() == CharClass::DIGIT) {
        lexeme.push_back(getChar());
        nextChar();
    }

    return lexeme;
}